

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall clipp::parser::try_match_blocked(parser *this,arg_string *arg)

{
  bool bVar1;
  parser *in_RDI;
  parser all;
  parser ahead;
  parser *in_stack_fffffffffffffde0;
  parser *this_00;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  group *in_stack_fffffffffffffe08;
  parser *in_stack_fffffffffffffe10;
  parser *in_stack_fffffffffffffe18;
  arg_index in_stack_fffffffffffffe34;
  group *in_stack_fffffffffffffe38;
  parser *in_stack_fffffffffffffe40;
  byte local_1;
  
  bVar1 = detail::scoped_dfs_traverser::operator_cast_to_bool((scoped_dfs_traverser *)0x191d5d);
  if (bVar1) {
    parser(in_RDI,(parser *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar1 = try_match_blocked(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                              (arg_string *)in_stack_fffffffffffffe08);
    if (bVar1) {
      local_1 = 1;
    }
    ~parser(in_stack_fffffffffffffde0);
    if (bVar1) goto LAB_00191ec3;
  }
  if (in_RDI->root_ != (group *)0x0) {
    this_00 = (parser *)&stack0xfffffffffffffe08;
    parser(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
    bVar1 = try_match_blocked(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                              (arg_string *)in_stack_fffffffffffffe08);
    if (bVar1) {
      local_1 = 1;
    }
    ~parser(this_00);
    if (bVar1) goto LAB_00191ec3;
  }
  local_1 = 0;
LAB_00191ec3:
  return (bool)(local_1 & 1);
}

Assistant:

bool try_match_blocked(const arg_string& arg)
    {
        //try to match ahead (using temporary parser)
        if(pos_) {
            auto ahead = *this;
            if(try_match_blocked(std::move(ahead), arg)) return true;
        }

        //try to match from the beginning (using temporary parser)
        if(root_) {
            parser all{*root_, index_+1};
            if(try_match_blocked(std::move(all), arg)) return true;
        }

        return false;
    }